

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QPointer<QWidget> __thiscall
QHash<QGesture_*,_QPointer<QWidget>_>::value
          (QHash<QGesture_*,_QPointer<QWidget>_> *this,QGesture **key)

{
  QPointer<QWidget> *pQVar1;
  QObject *extraout_RDX;
  QObject *extraout_RDX_00;
  QObject *pQVar2;
  Data *in_RDI;
  QPointer<QWidget> QVar3;
  QPointer<QWidget> *v;
  QPointer<QWidget> *in_stack_ffffffffffffffc8;
  Data *pDVar4;
  
  pDVar4 = in_RDI;
  pQVar1 = QHash<QGesture*,QPointer<QWidget>>::valueImpl<QGesture*>
                     ((QHash<QGesture_*,_QPointer<QWidget>_> *)in_RDI,(QGesture **)in_RDI);
  if (pQVar1 == (QPointer<QWidget> *)0x0) {
    memset(in_RDI,0,0x10);
    QPointer<QWidget>::QPointer((QPointer<QWidget> *)0x30ddcc);
    pQVar2 = extraout_RDX_00;
  }
  else {
    QPointer<QWidget>::QPointer((QPointer<QWidget> *)in_RDI,in_stack_ffffffffffffffc8);
    pQVar2 = extraout_RDX;
  }
  QVar3.wp.value = pQVar2;
  QVar3.wp.d = pDVar4;
  return (QPointer<QWidget>)QVar3.wp;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }